

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O1

void __thiscall Pyraminx::Pyraminx(Pyraminx *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Face *pFVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Eq_Pos_Table eq_pos_table;
  undefined1 local_89;
  Face *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  Color local_74;
  Eq_Pos_Table local_70;
  
  (this->yellow_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->green_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->red_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->yellow_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->red_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->face_list).
  super__Vector_base<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->face_list).
  super__Vector_base<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->face_list).
  super__Vector_base<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->green_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Eq_Pos_Table::Eq_Pos_Table(&local_70);
  local_74 = blue;
  local_88 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Face,std::allocator<Face>,Color,Eq_Pos_Table&>
            (&_Stack_80,&local_88,(allocator<Face> *)&local_89,&local_74,&local_70);
  _Var3._M_pi = _Stack_80._M_pi;
  pFVar2 = local_88;
  local_88 = (Face *)0x0;
  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pFVar2;
  (this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
  }
  local_74 = red;
  local_88 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Face,std::allocator<Face>,Color,Eq_Pos_Table&>
            (&_Stack_80,&local_88,(allocator<Face> *)&local_89,&local_74,&local_70);
  _Var3._M_pi = _Stack_80._M_pi;
  pFVar2 = local_88;
  local_88 = (Face *)0x0;
  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->red_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->red_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pFVar2;
  (this->red_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
  }
  local_74 = yellow;
  local_88 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Face,std::allocator<Face>,Color,Eq_Pos_Table&>
            (&_Stack_80,&local_88,(allocator<Face> *)&local_89,&local_74,&local_70);
  _Var3._M_pi = _Stack_80._M_pi;
  pFVar2 = local_88;
  local_88 = (Face *)0x0;
  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->yellow_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->yellow_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pFVar2;
  (this->yellow_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
  }
  local_74 = green;
  local_88 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Face,std::allocator<Face>,Color,Eq_Pos_Table&>
            (&_Stack_80,&local_88,(allocator<Face> *)&local_89,&local_74,&local_70);
  _Var3._M_pi = _Stack_80._M_pi;
  pFVar2 = local_88;
  local_88 = (Face *)0x0;
  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->green_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->green_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pFVar2;
  (this->green_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
  }
  std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::push_back
            (&this->face_list,&this->blue_face);
  std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::push_back
            (&this->face_list,&this->red_face);
  std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::push_back
            (&this->face_list,&this->yellow_face);
  std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::push_back
            (&this->face_list,&this->green_face);
  set_neighbors(this);
  std::
  vector<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ::~vector(&local_70.green_eq);
  std::
  vector<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ::~vector(&local_70.red_eq);
  std::
  vector<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ::~vector(&local_70.yellow_eq);
  std::
  vector<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
  ::~vector(&local_70.blue_eq);
  return;
}

Assistant:

Pyraminx::Pyraminx(){
    Eq_Pos_Table eq_pos_table;

    blue_face = std::make_shared<Face>(Color::blue, eq_pos_table);
    red_face = std::make_shared<Face>(Color::red, eq_pos_table);
    yellow_face = std::make_shared<Face>(Color::yellow, eq_pos_table);
    green_face = std::make_shared<Face>(Color::green, eq_pos_table);

    face_list.push_back(blue_face);
    face_list.push_back(red_face);
    face_list.push_back(yellow_face);
    face_list.push_back(green_face); 
   set_neighbors();
}